

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O0

WitnessVersion
cfd::TransactionContextUtil::CheckSignWithPrivkeySimple
          (OutPoint *outpoint,Pubkey *pubkey,Privkey *privkey,AddressType address_type)

{
  ulong uVar1;
  CfdException *this;
  string *message;
  undefined8 uVar2;
  int in_ECX;
  WitnessVersion version;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  CfdSourceLocation *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  CfdError error_code;
  allocator *paVar3;
  CfdException *in_stack_ffffffffffffff00;
  WitnessVersion local_f0;
  allocator local_e9;
  string local_e8 [32];
  char *local_c8;
  undefined4 local_c0;
  char *local_b8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  char *local_88;
  undefined4 local_80;
  char *local_78;
  undefined1 local_6d;
  allocator local_59;
  string local_58 [32];
  char *local_38;
  undefined4 local_30;
  char *local_28;
  int local_1c;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_1c = in_ECX;
  uVar1 = cfd::core::OutPoint::IsValid();
  if ((uVar1 & 1) == 0) {
    local_38 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                       ,0x2f);
    local_38 = local_38 + 1;
    local_30 = 0x3f;
    local_28 = "CheckSignWithPrivkeySimple";
    core::logger::warn<>
              (in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_6d = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Invalid outpoint.",&local_59);
    core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffef0);
    local_6d = 0;
    __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  uVar1 = cfd::core::Pubkey::IsValid();
  if ((uVar1 & 1) != 0) {
    uVar1 = cfd::core::Privkey::IsInvalid();
    if ((uVar1 & 1) != 0) {
      local_c8 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                         ,0x2f);
      local_c8 = local_c8 + 1;
      local_c0 = 0x48;
      local_b8 = "CheckSignWithPrivkeySimple";
      core::logger::warn<>
                (in_stack_fffffffffffffee0,
                 (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"Invalid privkey.",&local_e9);
      core::CfdException::CfdException
                (in_stack_ffffffffffffff00,error_code,in_stack_fffffffffffffef0);
      __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    local_f0 = kVersionNone;
    if (local_1c - 3U < 4) {
      local_f0 = kVersion0;
    }
    else if (local_1c == 7) {
      local_f0 = kVersion1;
    }
    return local_f0;
  }
  local_88 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                     ,0x2f);
  local_88 = local_88 + 1;
  local_80 = 0x44;
  local_78 = "CheckSignWithPrivkeySimple";
  core::logger::warn<>
            (in_stack_fffffffffffffee0,
             (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_aa = 1;
  message = (string *)__cxa_allocate_exception(0x30);
  paVar3 = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"Invalid pubkey.",paVar3);
  core::CfdException::CfdException
            (in_stack_ffffffffffffff00,(CfdError)((ulong)paVar3 >> 0x20),message);
  local_aa = 0;
  __cxa_throw(message,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

WitnessVersion TransactionContextUtil::CheckSignWithPrivkeySimple(
    const OutPoint& outpoint, const Pubkey& pubkey, const Privkey& privkey,
    AddressType address_type) {
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to SignWithPrivkeySimple. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }
  if (!pubkey.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to SignWithPrivkeySimple. Invalid pubkey.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Invalid pubkey.");
  }
  if (privkey.IsInvalid()) {
    warn(CFD_LOG_SOURCE, "Failed to SignWithPrivkeySimple. Invalid privkey.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Invalid privkey.");
  }

  WitnessVersion version = WitnessVersion::kVersionNone;
  switch (address_type) {
    case AddressType::kP2wshAddress:
    case AddressType::kP2shP2wshAddress:
    case AddressType::kP2wpkhAddress:
    case AddressType::kP2shP2wpkhAddress:
      version = WitnessVersion::kVersion0;
      break;
    case AddressType::kTaprootAddress:
      version = WitnessVersion::kVersion1;
      break;
    default:
      break;
  }
  return version;
}